

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_storeRealSolutionAsRational<double>
          (SoPlexBase<double> *this,SolRational *sol,VectorBase<double> *primalReal,
          VectorBase<double> *dualReal,int *dualSize)

{
  VarStatus *pVVar1;
  Rational *pRVar2;
  double *pdVar3;
  undefined8 in_RDX;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RSI;
  long in_RDI;
  int *in_R8;
  longdouble lVar4;
  VarStatus *basisStatusRow;
  int r;
  VarStatus *basisStatusCol;
  int c;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined2 in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffee8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffef0;
  int local_b8;
  int local_a4;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff98;
  Rational *in_stack_ffffffffffffffa8;
  
  numColsRational((SoPlexBase<double> *)0x46a3ce);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(in_RSI,(int)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  numRowsRational((SoPlexBase<double> *)0x46a3f7);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(in_RSI,(int)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  numRowsRational((SoPlexBase<double> *)0x46a420);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(in_RSI,(int)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  numColsRational((SoPlexBase<double> *)0x46a449);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(in_RSI,(int)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  *(byte *)&in_RSI[8].val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(byte *)&in_RSI[8].val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xfe | 1;
  *(byte *)&in_RSI[8].val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(byte *)&in_RSI[8].val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xfb | 4;
  local_a4 = numColsRational((SoPlexBase<double> *)0x46a495);
  while (local_a4 = local_a4 + -1, -1 < local_a4) {
    pVVar1 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d88),
                        local_a4);
    if (*pVVar1 == ON_LOWER) {
      in_stack_ffffffffffffffa8 =
           lowerRational((SoPlexBase<double> *)
                         CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffedc);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
    else if (*pVVar1 == ON_UPPER) {
      pRVar2 = upperRational((SoPlexBase<double> *)
                             CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                             in_stack_fffffffffffffedc);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffedc);
      in_stack_ffffffffffffff98 = SUB82(pRVar2,0);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
    else if (*pVVar1 == FIXED) {
      lowerRational((SoPlexBase<double> *)
                    CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                    in_stack_fffffffffffffedc);
      in_stack_ffffffffffffff90 =
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pVVar1 = ON_LOWER;
    }
    else if (*pVVar1 == ZERO) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffedc);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
    else {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffedc);
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc);
      lVar4 = (longdouble)*pdVar3;
      in_stack_fffffffffffffed8 = SUB104(lVar4,0);
      in_stack_fffffffffffffedc = (int)((unkuint10)lVar4 >> 0x20);
      in_stack_fffffffffffffee0 = (undefined2)((unkuint10)lVar4 >> 0x40);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=(&in_stack_ffffffffffffffa8->m_backend,
                  (longdouble)CONCAT28(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90));
    }
  }
  (**(code **)(**(long **)(in_RDI + 0x45c0) + 0x230))
            (*(long **)(in_RDI + 0x45c0),in_RSI,in_RSI + 1,1);
  local_b8 = numRowsRational((SoPlexBase<double> *)0x46a730);
  while (local_b8 = local_b8 + -1, -1 < local_b8) {
    pVVar1 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d70),
                        local_b8);
    if (*pVVar1 == FIXED) {
      *pVVar1 = ON_LOWER;
    }
    in_stack_fffffffffffffef0 =
         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc);
    in_stack_fffffffffffffedc = (int)((unkuint10)(longdouble)*pdVar3 >> 0x20);
    in_stack_fffffffffffffee0 = (undefined2)((unkuint10)(longdouble)*pdVar3 >> 0x40);
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=(&in_stack_ffffffffffffffa8->m_backend,
                (longdouble)CONCAT28(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90));
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc);
    if ((*pdVar3 != 0.0) || (NAN(*pdVar3))) {
      *in_R8 = *in_R8 + 1;
    }
  }
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::getObj(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  (**(code **)(**(long **)(in_RDI + 0x45c0) + 0x250))
            (*(long **)(in_RDI + 0x45c0),in_RSI + 3,in_RSI + 4);
  return;
}

Assistant:

void SoPlexBase<R>::_storeRealSolutionAsRational(
   SolRational& sol,
   VectorBase<T>& primalReal,
   VectorBase<T>& dualReal,
   int& dualSize)
{
   sol._primal.reDim(numColsRational(), false);
   sol._slacks.reDim(numRowsRational(), false);
   sol._dual.reDim(numRowsRational(), false);
   sol._redCost.reDim(numColsRational(), false);
   sol._isPrimalFeasible = true;
   sol._isDualFeasible = true;

   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      typename SPxSolverBase<R>::VarStatus& basisStatusCol = _basisStatusCols[c];

      if(basisStatusCol == SPxSolverBase<R>::ON_LOWER)
         sol._primal[c] = lowerRational(c);
      else if(basisStatusCol == SPxSolverBase<R>::ON_UPPER)
         sol._primal[c] = upperRational(c);
      else if(basisStatusCol == SPxSolverBase<R>::FIXED)
      {
         // it may happen that lower and upper are only equal in the Real LP but different in the rational LP; we do
         // not check this to avoid rational comparisons, but simply switch the basis status to the lower bound; this
         // is necessary, because for fixed variables any reduced cost is feasible
         sol._primal[c] = lowerRational(c);
         basisStatusCol = SPxSolverBase<R>::ON_LOWER;
      }
      else if(basisStatusCol == SPxSolverBase<R>::ZERO)
         sol._primal[c] = 0;
      else
         sol._primal[c].assign(primalReal[c]);
   }

   _rationalLP->computePrimalActivity(sol._primal, sol._slacks);

   assert(dualSize == 0);

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      typename SPxSolverBase<R>::VarStatus& basisStatusRow = _basisStatusRows[r];

      // it may happen that left-hand and right-hand side are different in the rational, but equal in the Real LP,
      // leading to a fixed basis status; this is critical because rows with fixed basis status are ignored in the
      // computation of the dual violation; to avoid rational comparisons we do not check this but simply switch to
      // the left-hand side status
      if(basisStatusRow == SPxSolverBase<R>::FIXED)
         basisStatusRow = SPxSolverBase<R>::ON_LOWER;

      {
         sol._dual[r].assign(dualReal[r]);

         if(dualReal[r] != 0.0)
            dualSize++;
      }
   }

   // we assume that the objective function vector has less nonzeros than the reduced cost vector, and so multiplying
   // with -1 first and subtracting the dual activity should be faster than adding the dual activity and negating
   // afterwards
   _rationalLP->getObj(sol._redCost);
   _rationalLP->subDualActivity(sol._dual, sol._redCost);
}